

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Segment::Load(Segment *this)

{
  longlong lVar1;
  long lVar2;
  longlong unaff_RBP;
  longlong lVar3;
  bool bVar4;
  long size;
  longlong pos;
  long local_40;
  longlong local_38;
  
  lVar3 = -1;
  if (((this->m_clusters == (Cluster **)0x0) && (this->m_clusterSize == 0)) &&
     (this->m_clusterCount == 0)) {
    lVar1 = ParseHeaders(this);
    lVar3 = lVar1;
    if (((-1 < lVar1) && (lVar3 = -3, lVar1 == 0)) &&
       ((lVar3 = -2, this->m_pInfo != (SegmentInfo *)0x0 && (this->m_pTracks != (Tracks *)0x0)))) {
      do {
        do {
          lVar2 = DoLoadCluster(this,&local_38,&local_40);
        } while (1 < lVar2);
        if (lVar2 < 0) {
          bVar4 = false;
          unaff_RBP = lVar2;
        }
        else if (lVar2 == 0) {
          bVar4 = this->m_type != kTypeLiveStream;
          if (!bVar4) {
            unaff_RBP = 0;
          }
        }
        else {
          bVar4 = false;
          unaff_RBP = 0;
        }
        lVar3 = unaff_RBP;
      } while (bVar4);
    }
  }
  return lVar3;
}

Assistant:

long Segment::Load() {
  if (m_clusters != NULL || m_clusterSize != 0 || m_clusterCount != 0)
    return E_PARSE_FAILED;

  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.

  const long long header_status = ParseHeaders();

  if (header_status < 0)  // error
    return static_cast<long>(header_status);

  if (header_status > 0)  // underflow
    return E_BUFFER_NOT_FULL;

  if (m_pInfo == NULL || m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  for (;;) {
    const long status = LoadCluster();

    if (status < 0)  // error
      return status;

    if (status >= 1)  // no more clusters
      return 0;

    if (m_type == kTypeLiveStream)
      return 0; // Live streams only have one cluster loaded at any point in time.
  }
}